

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

_Bool patch_reloc(tcg_insn_unit *code_ptr,int type,intptr_t value,intptr_t addend)

{
  uint8_t v;
  intptr_t addend_local;
  intptr_t value_local;
  int type_local;
  tcg_insn_unit *code_ptr_local;
  
  addend_local = value + addend;
  if (type != 1) {
    if (type != 2) {
      if (type != 0x17) {
        fprintf(_stderr,"%s:%d: tcg fatal error\n",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
                ,0xc5);
        abort();
      }
      v = (uint8_t)(addend_local - (long)code_ptr);
      if (addend_local - (long)code_ptr == (long)(char)v) {
        tcg_patch8(code_ptr,v);
        return true;
      }
      return false;
    }
    addend_local = addend_local - (long)code_ptr;
    if (addend_local != (int)addend_local) {
      return false;
    }
  }
  tcg_patch32(code_ptr,(uint32_t)addend_local);
  return true;
}

Assistant:

static bool patch_reloc(tcg_insn_unit *code_ptr, int type,
                        intptr_t value, intptr_t addend)
{
    value += addend;
    switch(type) {
    case R_386_PC32:
        value -= (uintptr_t)code_ptr;
        if (value != (int32_t)value) {
            return false;
        }
        /* FALLTHRU */
    case R_386_32:
        tcg_patch32(code_ptr, value);
        break;
    case R_386_PC8:
        value -= (uintptr_t)code_ptr;
        if (value != (int8_t)value) {
            return false;
        }
        tcg_patch8(code_ptr, value);
        break;
    default:
        tcg_abort();
    }
    return true;
}